

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O2

StatusOr<int> google::protobuf::json_internal::UnparseProto3Type::GetInt32(Field f)

{
  lts_20240722 *this;
  bool bVar1;
  size_t *psVar2;
  char *pcVar3;
  Nonnull<int_*> in_RCX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long in_RSI;
  string_view str;
  StatusOr<int> SVar4;
  int32_t x;
  Status local_a0;
  undefined4 local_94;
  AlphaNum local_90;
  AlphaNum local_40;
  
  psVar2 = (size_t *)(*(ulong *)(*(long *)(in_RSI + 8) + 0x40) & 0xfffffffffffffffc);
  this = (lts_20240722 *)psVar2[1];
  if (this == (lts_20240722 *)0x0) {
    *(undefined4 *)&f->raw_ = 0;
  }
  else {
    str._M_str = (char *)&local_94;
    str._M_len = *psVar2;
    bVar1 = absl::lts_20240722::SimpleAtoi<int>(this,str,in_RCX);
    if (!bVar1) {
      local_40.piece_ = absl::lts_20240722::NullSafeStringView("bad default value in type.proto: ");
      pcVar3 = (char *)(*(ulong *)(*(long *)(in_RSI + 0x10) + 0x68) & 0xfffffffffffffffc);
      local_90.digits_._24_8_ = *(undefined8 *)pcVar3;
      local_90.digits_._16_8_ = *(undefined8 *)(pcVar3 + 8);
      absl::lts_20240722::StrCat_abi_cxx11_(&local_90,&local_40);
      absl::lts_20240722::InternalError(&local_a0,local_90.piece_._M_str,local_90.piece_._M_len);
      absl::lts_20240722::internal_statusor::StatusOrData<int>::
      StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&local_a0);
      absl::lts_20240722::Status::~Status(&local_a0);
      std::__cxx11::string::~string((string *)&local_90);
      in_RDX = extraout_RDX_00;
      goto LAB_002a2326;
    }
    *(undefined4 *)&f->raw_ = local_94;
    in_RDX = extraout_RDX;
  }
  f->pool_ = (ResolverPool *)0x1;
LAB_002a2326:
  SVar4.super_StatusOrData<int>._8_8_ = in_RDX;
  SVar4.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
  return (StatusOr<int>)SVar4.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> GetInt32(Field f) {
    if (f->proto().default_value().empty()) {
      return 0;
    }
    int32_t x;
    if (!absl::SimpleAtoi(f->proto().default_value(), &x)) {
      return absl::InternalError(absl::StrCat(
          "bad default value in type.proto: ", f->parent().proto().name()));
    }
    return x;
  }